

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_get_key_domain_parameters
          (psa_key_attributes_t *attributes,uint8_t *data,size_t data_size,size_t *data_length)

{
  size_t *data_length_local;
  size_t data_size_local;
  uint8_t *data_local;
  psa_key_attributes_t *attributes_local;
  
  if (data_size < attributes->domain_parameters_size) {
    attributes_local._4_4_ = -0x8a;
  }
  else {
    *data_length = attributes->domain_parameters_size;
    if (attributes->domain_parameters_size != 0) {
      memcpy(data,attributes->domain_parameters,attributes->domain_parameters_size);
    }
    attributes_local._4_4_ = 0;
  }
  return attributes_local._4_4_;
}

Assistant:

psa_status_t psa_get_key_domain_parameters(
    const psa_key_attributes_t *attributes,
    uint8_t *data, size_t data_size, size_t *data_length )
{
    if( attributes->domain_parameters_size > data_size )
        return( PSA_ERROR_BUFFER_TOO_SMALL );
    *data_length = attributes->domain_parameters_size;
    if( attributes->domain_parameters_size != 0 )
        memcpy( data, attributes->domain_parameters,
                attributes->domain_parameters_size );
    return( PSA_SUCCESS );
}